

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  uint local_84;
  int fCompl;
  int iRes;
  int iEntry;
  int uTruth;
  int Lits [5];
  int local_38;
  int local_34;
  int iLit;
  int i;
  int *pMapping;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  p_local._4_4_ = Saig_ManBmcLiteral(p,pObj,iFrame);
  if (p_local._4_4_ == -1) {
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x3f8,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                        ,0x408,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        puVar5 = (uint *)Saig_ManBmcMapping(p,pObj);
        for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
          if (puVar5[local_34 + 1] == 0xffffffff) {
            (&iEntry)[local_34] = -1;
          }
          else {
            pAVar4 = Aig_ManObj(p->pAig,puVar5[local_34 + 1]);
            iVar1 = Saig_ManBmcCreateCnf_rec(p,pAVar4,iFrame);
            (&iEntry)[local_34] = iVar1;
          }
        }
        uVar2 = Saig_ManBmcReduceTruth(*puVar5 & 0xffff,&iEntry);
        if ((uVar2 == 0) || (uVar2 == 0xffff)) {
          p_local._4_4_ = Saig_ManBmcSetLiteral(p,pObj,iFrame,(uint)(uVar2 == 0xffff));
        }
        else {
          local_84 = Dar_CutSortVars(uVar2,&iEntry);
          if ((local_84 == 0) || (local_84 == 0xffff)) {
            __assert_fail("uTruth != 0 && uTruth != 0xffff",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                          ,0x419,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
          }
          if ((local_84 == 0xaaaa) || (local_84 == 0x5555)) {
            local_38 = Abc_LitNotCond(iEntry,(uint)(local_84 == 0x5555));
            p->nBufNum = p->nBufNum + 1;
          }
          else {
            uVar2 = local_84 & 1;
            if ((local_84 & 1) != 0) {
              local_84 = (local_84 ^ 0xffffffff) & 0xffff;
            }
            Lits[2] = local_84;
            iVar1 = Vec_IntSize(p->vData);
            iVar1 = iVar1 / 5;
            iVar3 = Vec_IntSize(p->vData);
            if (iVar1 * 5 != iVar3) {
              __assert_fail("iEntry * 5 == Vec_IntSize(p->vData)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                            ,0x425,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)")
              ;
            }
            for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
              Vec_IntPush(p->vData,(&iEntry)[local_34]);
            }
            iVar3 = Hsh_IntManAdd(p->vHash,iVar1);
            if (iVar3 == iVar1) {
              iVar3 = p->nSatVars;
              p->nSatVars = iVar3 + 1;
              local_38 = toLit(iVar3);
              Saig_ManBmcAddClauses(p,Lits[2],&iEntry,local_38);
              iVar3 = Vec_IntSize(p->vId2Lit);
              if (iVar1 != iVar3) {
                __assert_fail("iEntry == Vec_IntSize(p->vId2Lit)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                              ,0x42d,
                              "int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
              }
              Vec_IntPush(p->vId2Lit,local_38);
              p->nHashMiss = p->nHashMiss + 1;
            }
            else {
              local_38 = Vec_IntEntry(p->vId2Lit,iVar3);
              p_00 = p->vData;
              iVar1 = Vec_IntSize(p->vData);
              Vec_IntShrink(p_00,iVar1 + -5);
              p->nHashHit = p->nHashHit + 1;
            }
            local_38 = Abc_LitNotCond(local_38,uVar2);
          }
          p_local._4_4_ = Saig_ManBmcSetLiteral(p,pObj,iFrame,local_38);
        }
      }
      else {
        pAVar4 = Aig_ObjFanin0(pObj);
        local_38 = Saig_ManBmcCreateCnf_rec(p,pAVar4,iFrame);
        iVar1 = Aig_ObjFaninC0(pObj);
        if (iVar1 != 0) {
          local_38 = lit_neg(local_38);
        }
        p_local._4_4_ = Saig_ManBmcSetLiteral(p,pObj,iFrame,local_38);
      }
    }
    else {
      iVar1 = Saig_ObjIsPi(p->pAig,pObj);
      if (iVar1 == 0) {
        pAVar4 = Saig_ObjLoToLi(p->pAig,pObj);
        local_38 = Saig_ManBmcCreateCnf_rec(p,pAVar4,iFrame + -1);
      }
      else {
        iVar1 = p->nSatVars;
        p->nSatVars = iVar1 + 1;
        local_38 = toLit(iVar1);
      }
      p_local._4_4_ = Saig_ManBmcSetLiteral(p,pObj,iFrame,local_38);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManBmcCreateCnf_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    extern unsigned Dar_CutSortVars( unsigned uTruth, int * pVars );
    int * pMapping, i, iLit, Lits[5], uTruth;
    iLit = Saig_ManBmcLiteral( p, pObj, iFrame );
    if ( iLit != ~0 )
        return iLit; 
    assert( iFrame >= 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            iLit = toLit( p->nSatVars++ );
        else
            iLit = Saig_ManBmcCreateCnf_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame-1 );
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        iLit = Saig_ManBmcCreateCnf_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            iLit = lit_neg(iLit);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    assert( Aig_ObjIsNode(pObj) );
    pMapping = Saig_ManBmcMapping( p, pObj );
    for ( i = 0; i < 4; i++ )
        if ( pMapping[i+1] == -1 )
            Lits[i] = -1;
        else
            Lits[i] = Saig_ManBmcCreateCnf_rec( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame );
    uTruth = 0xffff & (unsigned)pMapping[0];
    // propagate constants
    uTruth = Saig_ManBmcReduceTruth( uTruth, Lits );
    if ( uTruth == 0 || uTruth == 0xffff )
    {
        iLit = (uTruth == 0xffff);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    // canonicize inputs
    uTruth = Dar_CutSortVars( uTruth, Lits );
    assert( uTruth != 0 && uTruth != 0xffff );
    if ( uTruth == 0xAAAA || uTruth == 0x5555 )
    {
        iLit = Abc_LitNotCond( Lits[0], uTruth == 0x5555 );
        p->nBufNum++;
    }
    else 
    {
        int iEntry, iRes;
        int fCompl = (uTruth & 1);
        Lits[4] = (uTruth & 1) ? 0xffff & ~uTruth : uTruth;
        iEntry = Vec_IntSize(p->vData) / 5;
        assert( iEntry * 5 == Vec_IntSize(p->vData) );
        for ( i = 0; i < 5; i++ )
            Vec_IntPush( p->vData, Lits[i] );
        iRes = Hsh_IntManAdd( p->vHash, iEntry );
        if ( iRes == iEntry )
        {
            iLit = toLit( p->nSatVars++ );
            Saig_ManBmcAddClauses( p, Lits[4], Lits, iLit );
            assert( iEntry == Vec_IntSize(p->vId2Lit) );
            Vec_IntPush( p->vId2Lit, iLit );
            p->nHashMiss++;
        }
        else
        {
            iLit = Vec_IntEntry( p->vId2Lit, iRes );
            Vec_IntShrink( p->vData, Vec_IntSize(p->vData) - 5 );
            p->nHashHit++;
        }
        iLit = Abc_LitNotCond( iLit, fCompl );
    }
    return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
}